

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer ppcVar1;
  cmCPackIFWGenerator *pcVar2;
  cmCPackLog *pcVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  cmValue cVar7;
  mapped_type *__v;
  ostream *poVar8;
  iterator __begin2;
  pointer ppcVar9;
  string local_1f0;
  string prefix;
  cmCPackComponent *dep;
  
  if (component == (cmCPackComponent *)0x0) {
    iVar5 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_1f0,&component->Name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep,
                   "CPACK_IFW_COMPONENT_",&local_1f0);
    std::operator+(&prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep
                   ,"_");
    std::__cxx11::string::~string((string *)&dep);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dep,"",(allocator<char> *)&local_1f0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,(key_type *)&dep);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&dep);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dep,"",(allocator<char> *)&local_1f0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,(key_type *)&dep);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&dep);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep,&prefix
                   ,"VERSION");
    cVar7 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&dep);
    std::__cxx11::string::~string((string *)&dep);
    if (cVar7.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dep,"CPACK_PACKAGE_VERSION",(allocator<char> *)&local_1f0);
      cVar7 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&dep);
      std::__cxx11::string::~string((string *)&dep);
      if (cVar7.Value == (string *)0x0) {
        std::__cxx11::string::assign((char *)&this->Version);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&this->Version);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->Version);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep,&prefix
                   ,"SCRIPT");
    cVar7 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&dep);
    std::__cxx11::string::~string((string *)&dep);
    if (cVar7.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->Script);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep,&prefix
                   ,"USER_INTERFACES");
    cVar7 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&dep);
    std::__cxx11::string::~string((string *)&dep);
    if (cVar7.Value != (string *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->UserInterfaces);
      cmList::append(&this->UserInterfaces,cVar7,No);
    }
    ppcVar9 = (component->Dependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar1 = (component->Dependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppcVar9 != ppcVar1) {
      for (; ppcVar9 != ppcVar1; ppcVar9 = ppcVar9 + 1) {
        dep = *ppcVar9;
        __v = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&((this->super_cmCPackIFWCommon).Generator)->ComponentPackages,&dep);
        std::
        _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
        ::_M_insert_unique<cmCPackIFWPackage*const&>
                  ((_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                    *)&this->Dependencies,__v);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep,&prefix
                   ,"LICENSES");
    cVar7 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&dep);
    std::__cxx11::string::~string((string *)&dep);
    if (cVar7.Value != (string *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_00);
      cmList::append(this_00,cVar7,No);
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
        poVar8 = std::operator<<((ostream *)&dep,(string *)&prefix);
        poVar8 = std::operator<<(poVar8,"LICENSES");
        poVar8 = std::operator<<(poVar8," should contain pairs of <display_name> and <file_path>.");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar2 = (this->super_cmCPackIFWCommon).Generator;
        if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
          pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar3,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0xf4,local_1f0._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(this_00);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep,&prefix
                   ,"PRIORITY");
    cVar7 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&dep);
    std::__cxx11::string::~string((string *)&dep);
    if (cVar7.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->SortingPriority);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dep);
      poVar8 = std::operator<<((ostream *)&dep,"The \"PRIORITY\" option is set ");
      poVar8 = std::operator<<(poVar8,"for component \"");
      poVar8 = std::operator<<(poVar8,(string *)component);
      poVar8 = std::operator<<(poVar8,"\", but there option is ");
      poVar8 = std::operator<<(poVar8,"deprecated. Please use \"SORTING_PRIORITY\" option instead.")
      ;
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar2 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
        pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar3,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0x101,local_1f0._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dep);
    }
    std::__cxx11::string::assign((char *)&this->Default);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep,&prefix
                   ,"ESSENTIAL");
    bVar4 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)&dep);
    std::__cxx11::string::~string((string *)&dep);
    if (bVar4) {
      std::__cxx11::string::assign((char *)&this->Essential);
    }
    std::__cxx11::string::assign((char *)&this->Virtual);
    std::__cxx11::string::assign((char *)&this->ForcedInstallation);
    ConfigureFromPrefix(this,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent* component)
{
  if (!component) {
    return 0;
  }

  // Restore default configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";

  // Display name
  this->DisplayName[""] = component->DisplayName;

  // Description
  this->Description[""] = component->Description;

  // Version
  if (cmValue optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = *optVERSION;
  } else if (cmValue optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = *optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (cmValue option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = *option;
  }

  // User interfaces
  if (cmValue option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmExpandList(option, this->UserInterfaces);
  }

  // CMake dependencies
  if (!component->Dependencies.empty()) {
    for (cmCPackComponent* dep : component->Dependencies) {
      this->Dependencies.insert(this->Generator->ComponentPackages[dep]);
    }
  }

  // Licenses
  if (cmValue option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmExpandList(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (cmValue option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = *option;
    cmCPackIFWLogger(
      WARNING,
      "The \"PRIORITY\" option is set "
        << "for component \"" << component->Name << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  // Default
  this->Default = component->IsDisabledByDefault ? "false" : "true";

  // Essential
  if (this->IsOn(prefix + "ESSENTIAL")) {
    this->Essential = "true";
  }

  // Virtual
  this->Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  this->ForcedInstallation = component->IsRequired ? "true" : "false";

  return this->ConfigureFromPrefix(prefix);
}